

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_adaptive_code.hpp
# Opt level: O0

void __thiscall
LDPC4QKD::RateAdaptiveCode<unsigned_short>::RateAdaptiveCode<unsigned_int>
          (RateAdaptiveCode<unsigned_short> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *colptr,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *rowIdx)

{
  reference puVar1;
  size_type sVar2;
  unsigned_short n_line_combs;
  allocator<unsigned_short> local_49;
  initializer_list<unsigned_short> local_48;
  unsigned_short *local_38;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_30;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_28;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_20;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *rowIdx_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *colptr_local;
  RateAdaptiveCode<unsigned_short> *this_local;
  
  local_20 = rowIdx;
  rowIdx_local = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)colptr;
  colptr_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  local_30._M_current =
       (unsigned_short *)std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(rowIdx)
  ;
  local_38 = (unsigned_short *)
             std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(local_20);
  local_28 = std::
             max_element<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                       (local_30,(__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                  )local_38);
  puVar1 = __gnu_cxx::
           __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
           ::operator*(&local_28);
  this->n_mother_rows = (ulong)(*puVar1 + 1);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)rowIdx_local);
  this->n_cols = sVar2 - 1;
  compute_mother_pos_varn<unsigned_int>
            (&this->mother_pos_varn,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)rowIdx_local,local_20);
  std::initializer_list<unsigned_short>::initializer_list(&local_48);
  std::allocator<unsigned_short>::allocator(&local_49);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&this->rows_to_combine,local_48,&local_49);
  std::allocator<unsigned_short>::~allocator(&local_49);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector(&this->pos_checkn);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector(&this->pos_varn);
  this->n_ra_rows = 0;
  recompute_pos_vn_cn(this,0);
  return;
}

Assistant:

RateAdaptiveCode(const std::vector<colptr_t> &colptr, const std::vector<idx_t> &rowIdx)
                : n_mother_rows(*std::max_element(rowIdx.begin(), rowIdx.end()) + 1u),
                  n_cols(colptr.size() - 1),
                  mother_pos_varn(compute_mother_pos_varn(colptr, rowIdx)), // computed here and henceforth `const`!
                  rows_to_combine({}) {
            constexpr idx_t n_line_combs = 0;
            recompute_pos_vn_cn(n_line_combs);
        }